

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioPluginUtil.cpp
# Opt level: O1

void __thiscall
FFTAnalyzer::AnalyzeInput
          (FFTAnalyzer *this,float *data,int numchannels,int numsamples,float decaySpeed)

{
  float fVar1;
  float *pfVar2;
  UnityComplexNumber *pUVar3;
  float *pfVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  float fVar9;
  
  CheckInitialized(this);
  uVar8 = this->spectrumSize;
  if (uVar8 - numsamples != 0 && numsamples <= (int)uVar8) {
    pfVar2 = this->ibuffer;
    uVar6 = 0;
    do {
      pfVar2[uVar6] = pfVar2[(long)numsamples + uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar8 - numsamples != uVar6);
  }
  if (0 < numsamples) {
    pfVar2 = this->ibuffer;
    iVar5 = uVar8 - numsamples;
    uVar6 = (ulong)(uint)numsamples;
    do {
      pfVar2[iVar5] = *data;
      data = data + numchannels;
      iVar5 = iVar5 + 1;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  if (0 < (int)uVar8) {
    pUVar3 = this->cspec;
    pfVar2 = this->window;
    pfVar4 = this->ibuffer;
    uVar6 = 0;
    do {
      pUVar3[uVar6].re = pfVar4[uVar6] * pfVar2[uVar6];
      pUVar3[uVar6].im = 0.0;
      uVar6 = uVar6 + 1;
    } while (uVar8 != uVar6);
  }
  FFTProcess<double>(this->cspec,uVar8,true);
  if (1 < this->spectrumSize) {
    lVar7 = 0;
    do {
      fVar9 = this->cspec[lVar7].re;
      fVar1 = this->cspec[lVar7].im;
      fVar9 = fVar9 * fVar9 + fVar1 * fVar1;
      if (fVar9 < 0.0) {
        fVar9 = sqrtf(fVar9);
      }
      else {
        fVar9 = SQRT(fVar9);
      }
      uVar8 = -(uint)(this->ispec2[lVar7] < fVar9);
      this->ispec1[lVar7] =
           (float)(uVar8 & (uint)fVar9 | ~uVar8 & (uint)(this->ispec2[lVar7] * decaySpeed));
      lVar7 = lVar7 + 1;
    } while (lVar7 < this->spectrumSize / 2);
  }
  return;
}

Assistant:

void FFTAnalyzer::AnalyzeInput(float* data, int numchannels, int numsamples, float decaySpeed)
{
    CheckInitialized();

    for (int n = 0; n < spectrumSize - numsamples; n++)
        ibuffer[n] = ibuffer[n + numsamples];
    for (int n = 0; n < numsamples; n++)
        ibuffer[n + spectrumSize - numsamples] = data[n * numchannels];
    for (int n = 0; n < spectrumSize; n++)
        cspec[n].Set(ibuffer[n] * window[n], 0.0f);
    Forward(cspec, spectrumSize, true);
    for (int n = 0; n < spectrumSize / 2; n++)
    {
        float a = cspec[n].Magnitude();
        ispec1[n] = (a > ispec2[n]) ? a : ispec2[n] * decaySpeed;
    }
}